

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

void recff_type(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = rd->argv->it64 >> 0x2f;
  uVar3 = 0xd;
  if (0xfffffffffffffff2 < uVar2) {
    uVar3 = ~uVar2;
  }
  TVar1 = lj_ir_kgc(J,(GCobj *)(*(ulong *)((long)J->fn + uVar3 * 8 + 0x30) & 0x7fffffffffff),IRT_STR
                   );
  *J->base = TVar1;
  return;
}

Assistant:

static void LJ_FASTCALL recff_type(jit_State *J, RecordFFData *rd)
{
  /* Arguments already specialized. Result is a constant string. Neat, huh? */
  uint32_t t;
  if (tvisnumber(&rd->argv[0]))
    t = ~LJ_TNUMX;
  else if (LJ_64 && !LJ_GC64 && tvislightud(&rd->argv[0]))
    t = ~LJ_TLIGHTUD;
  else
    t = ~itype(&rd->argv[0]);
  J->base[0] = lj_ir_kstr(J, strV(&J->fn->c.upvalue[t]));
  UNUSED(rd);
}